

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer *this_00;
  xpath_lexer_string *pxVar1;
  byte bVar2;
  lexeme_t lVar3;
  lexeme_t lVar4;
  xpath_allocator *__src;
  bool bVar5;
  bool bVar6;
  nodetest_t nVar7;
  xpath_ast_node *pxVar8;
  ulong uVar9;
  xpath_ast_node *pxVar10;
  xpath_ast_node *pxVar11;
  xpath_parse_result *pxVar12;
  char *pcVar13;
  size_t __n;
  undefined4 uVar14;
  xpath_ast_node *pxVar15;
  xpath_allocator *local_48;
  char_t *pcStack_40;
  char_t *local_38;
  
  if ((set != (xpath_ast_node *)0x0) && (set->_rettype != '\x01')) {
    pxVar12 = this->_result;
    pcVar13 = "Step has to be applied to node set";
    goto LAB_0070ec85;
  }
  this_00 = &this->_lexer;
  lVar3 = (this->_lexer)._cur_lexeme;
  if (lVar3 == lex_double_dot) {
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxVar8 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar8 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = '\t';
      pxVar8->_test = '\x02';
LAB_0070e7ca:
      pxVar8->_left = set;
      pxVar8->_right = (xpath_ast_node *)0x0;
      pxVar8->_next = (xpath_ast_node *)0x0;
      (pxVar8->_data).string = (char_t *)0x0;
      return pxVar8;
    }
  }
  else {
    if (lVar3 != lex_dot) {
      pcVar13 = &set->_type;
      if (lVar3 != lex_axis_attribute) {
        uVar14 = 3;
      }
      else {
        xpath_lexer::next(this_00);
        uVar14 = 2;
      }
      local_48 = (xpath_allocator *)0x0;
      pcStack_40 = (char_t *)0x0;
      lVar4 = (this->_lexer)._cur_lexeme;
      if (lVar4 == lex_multiply) {
        xpath_lexer::next(this_00);
        nVar7 = nodetest_all;
      }
      else {
        if (lVar4 != lex_string) {
LAB_0070ec7a:
          pxVar12 = this->_result;
          pcVar13 = "Unrecognized node test";
          goto LAB_0070ec85;
        }
        pxVar1 = &(this->_lexer)._cur_lexeme_contents;
        local_48 = (xpath_allocator *)(this->_lexer)._cur_lexeme_contents.begin;
        pcStack_40 = (this->_lexer)._cur_lexeme_contents.end;
        xpath_lexer::next(this_00);
        if ((this->_lexer)._cur_lexeme == lex_double_colon) {
          if (lVar3 == lex_axis_attribute) {
            pxVar12 = this->_result;
            pcVar13 = "Two axis specifiers in one step";
            goto LAB_0070ec85;
          }
          bVar2 = *(byte *)&local_48->_root;
          if (bVar2 < 0x6e) {
            switch(bVar2) {
            case 0x61:
              pcVar13 = "ancestor";
              bVar6 = xpath_lexer_string::operator==
                                ((xpath_lexer_string *)&stack0xffffffffffffffb8,"ancestor");
              uVar14 = 0;
              bVar5 = true;
              if (!bVar6) {
                pcVar13 = "ancestor-or-self";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffb8,"ancestor-or-self"
                                  );
                uVar14 = 1;
                if (!bVar6) {
                  pcVar13 = "attribute";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffb8,"attribute");
                  uVar14 = 2;
                  goto LAB_0070ec40;
                }
              }
              break;
            default:
              goto switchD_0070e86e_caseD_62;
            case 99:
              pcVar13 = "child";
              bVar5 = xpath_lexer_string::operator==
                                ((xpath_lexer_string *)&stack0xffffffffffffffb8,"child");
              if (!bVar5) goto switchD_0070e86e_caseD_62;
              uVar14 = 3;
LAB_0070ebeb:
              bVar5 = true;
              break;
            case 100:
              pcVar13 = "descendant";
              bVar6 = xpath_lexer_string::operator==
                                ((xpath_lexer_string *)&stack0xffffffffffffffb8,"descendant");
              uVar14 = 4;
              bVar5 = true;
              if (!bVar6) {
                pcVar13 = "descendant-or-self";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffb8,
                                   "descendant-or-self");
                uVar14 = 5;
LAB_0070ec40:
                bVar5 = true;
                if (bVar6 == false) goto switchD_0070e86e_caseD_62;
              }
              break;
            case 0x66:
              pcVar13 = "following";
              bVar6 = xpath_lexer_string::operator==
                                ((xpath_lexer_string *)&stack0xffffffffffffffb8,"following");
              uVar14 = 6;
              bVar5 = true;
              if (!bVar6) {
                pcVar13 = "following-sibling";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffb8,
                                   "following-sibling");
                uVar14 = 7;
                goto LAB_0070ec40;
              }
            }
          }
          else {
            if (bVar2 == 0x6e) {
              pcVar13 = "namespace";
              bVar5 = xpath_lexer_string::operator==
                                ((xpath_lexer_string *)&stack0xffffffffffffffb8,"namespace");
              if (bVar5) {
                uVar14 = 8;
                goto LAB_0070ebeb;
              }
            }
            else {
              if (bVar2 == 0x70) {
                pcVar13 = "parent";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffb8,"parent");
                uVar14 = 9;
                bVar5 = true;
                if (!bVar6) {
                  pcVar13 = "preceding";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffb8,"preceding");
                  uVar14 = 10;
                  if (!bVar6) {
                    pcVar13 = "preceding-sibling";
                    bVar6 = xpath_lexer_string::operator==
                                      ((xpath_lexer_string *)&stack0xffffffffffffffb8,
                                       "preceding-sibling");
                    uVar14 = 0xb;
                    goto LAB_0070ec40;
                  }
                }
                goto LAB_0070ec4c;
              }
              if (bVar2 == 0x73) {
                pcVar13 = "self";
                bVar5 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffb8,"self");
                if (bVar5) {
                  uVar14 = 0xc;
                  goto LAB_0070ebeb;
                }
              }
            }
switchD_0070e86e_caseD_62:
            uVar14 = 3;
            bVar5 = false;
          }
LAB_0070ec4c:
          if (!bVar5) {
            pxVar12 = this->_result;
            pcVar13 = "Unknown axis";
            goto LAB_0070ec85;
          }
          xpath_lexer::next(this_00);
          lVar3 = (this->_lexer)._cur_lexeme;
          if (lVar3 == lex_string) {
            local_48 = (xpath_allocator *)pxVar1->begin;
            pcStack_40 = (this->_lexer)._cur_lexeme_contents.end;
            nVar7 = nodetest_none;
            bVar5 = true;
          }
          else {
            if (lVar3 != lex_multiply) goto LAB_0070ec7a;
            local_48 = (xpath_allocator *)0x0;
            pcStack_40 = (char_t *)0x0;
            nVar7 = nodetest_all;
            bVar5 = false;
          }
          xpath_lexer::next(this_00);
        }
        else {
          nVar7 = nodetest_none;
          bVar5 = true;
        }
        if (bVar5) {
          if ((this->_lexer)._cur_lexeme == lex_open_brace) {
            xpath_lexer::next(this_00);
            lVar3 = (this->_lexer)._cur_lexeme;
            if (lVar3 == lex_close_brace) {
              xpath_lexer::next(this_00);
              nVar7 = parse_node_test_type
                                ((xpath_parser *)&stack0xffffffffffffffb8,
                                 (xpath_lexer_string *)pcVar13);
              if (nVar7 == nodetest_none) {
                pxVar12 = this->_result;
                pcVar13 = "Unrecognized node type";
                goto LAB_0070ec85;
              }
              local_48 = (xpath_allocator *)0x0;
              pcStack_40 = (char_t *)0x0;
            }
            else {
              bVar5 = xpath_lexer_string::operator==
                                ((xpath_lexer_string *)&stack0xffffffffffffffb8,
                                 "processing-instruction");
              if (!bVar5) {
                pxVar12 = this->_result;
                pcVar13 = "Unmatched brace near node type test";
                goto LAB_0070ec85;
              }
              if (lVar3 != lex_quoted_string) {
                pxVar12 = this->_result;
                pcVar13 = "Only literals are allowed as arguments to processing-instruction()";
                goto LAB_0070ec85;
              }
              local_48 = (xpath_allocator *)pxVar1->begin;
              pcStack_40 = (this->_lexer)._cur_lexeme_contents.end;
              xpath_lexer::next(this_00);
              if ((this->_lexer)._cur_lexeme != lex_close_brace) {
                pxVar12 = this->_result;
                pcVar13 = "Unmatched brace near processing-instruction()";
                goto LAB_0070ec85;
              }
              xpath_lexer::next(this_00);
              nVar7 = nodetest_pi;
            }
          }
          else if ((((long)pcStack_40 - (long)local_48 < 3) || (pcStack_40[-2] != ':')) ||
                  (pcStack_40[-1] != '*')) {
            nVar7 = nodetest_name;
          }
          else {
            pcStack_40 = pcStack_40 + -1;
            nVar7 = nodetest_all_in_namespace;
          }
        }
      }
      __src = local_48;
      local_38 = (char_t *)CONCAT44(local_38._4_4_,uVar14);
      if (local_48 == (xpath_allocator *)0x0) {
        pcVar13 = "";
      }
      else {
        __n = (long)pcStack_40 - (long)local_48;
        pcVar13 = (char *)xpath_allocator::allocate(this->_alloc,__n + 1);
        if (pcVar13 == (char *)0x0) {
          pcVar13 = (char *)0x0;
        }
        else {
          memcpy(pcVar13,__src,__n);
          pcVar13[__n] = '\0';
        }
      }
      if (pcVar13 == (char *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar8 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar8 == (xpath_ast_node *)0x0) {
        pxVar8 = (xpath_ast_node *)0x0;
      }
      else {
        pxVar8->_type = '8';
        pxVar8->_rettype = '\x01';
        pxVar8->_axis = (char)local_38;
        pxVar8->_test = (char)nVar7;
        pxVar8->_left = set;
        pxVar8->_right = (xpath_ast_node *)0x0;
        pxVar8->_next = (xpath_ast_node *)0x0;
        (pxVar8->_data).string = pcVar13;
      }
      if (pxVar8 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      local_38 = (char_t *)this->_depth;
      pxVar15 = (xpath_ast_node *)0x0;
      while( true ) {
        if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
          this->_depth = (size_t)local_38;
          return pxVar8;
        }
        xpath_lexer::next(this_00);
        uVar9 = this->_depth + 1;
        this->_depth = uVar9;
        if (0x400 < uVar9) break;
        bVar5 = false;
        pxVar10 = parse_expression(this,0);
        if (pxVar10 != (xpath_ast_node *)0x0) {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            pxVar11 = (xpath_ast_node *)0x0;
          }
          else {
            pxVar11->_type = '\x10';
            pxVar11->_rettype = '\x01';
            pxVar11->_axis = '\0';
            pxVar11->_test = '\0';
            pxVar11->_left = (xpath_ast_node *)0x0;
            pxVar11->_right = pxVar10;
            pxVar11->_next = (xpath_ast_node *)0x0;
          }
          if (pxVar11 != (xpath_ast_node *)0x0) {
            if ((this->_lexer)._cur_lexeme == lex_close_square_brace) {
              xpath_lexer::next(this_00);
              if (pxVar15 == (xpath_ast_node *)0x0) {
                pxVar8->_right = pxVar11;
              }
              else {
                pxVar15->_next = pxVar11;
              }
              bVar5 = true;
              pxVar15 = pxVar11;
              goto LAB_0070ea6d;
            }
            pxVar12 = this->_result;
            pxVar12->error = "Expected \']\' to match an opening \'[\'";
            pxVar12->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
          }
          bVar5 = false;
        }
LAB_0070ea6d:
        if (!bVar5) {
          return (xpath_ast_node *)0x0;
        }
      }
      pxVar12 = this->_result;
      pcVar13 = "Exceeded maximum allowed query depth";
      goto LAB_0070ec85;
    }
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
      pxVar8 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar8 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = '\f';
      pxVar8->_test = '\x02';
      goto LAB_0070e7ca;
    }
  }
  pxVar12 = this->_result;
  pcVar13 = "Predicates are not allowed after an abbreviated step";
LAB_0070ec85:
  pxVar12->error = pcVar13;
  pxVar12->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, NULL);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, NULL);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return NULL;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return NULL;

			size_t old_depth = _depth;

			xpath_ast_node* last = NULL;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return NULL;

				xpath_ast_node* pred = alloc_node(ast_predicate, NULL, expr, predicate_default);
				if (!pred) return NULL;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			_depth = old_depth;

			return n;
		}